

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void mstltest(void)

{
  int N_00;
  int iVar1;
  double *x_00;
  void *pvVar2;
  double lambda;
  double *pdStack_9c98;
  int s_window;
  double *remainder;
  double *trend;
  double **seasonal;
  uint uStack_9c78;
  int iterate;
  int f [2];
  int Nseas;
  int j;
  int i;
  int N;
  double *x;
  double temp [5000];
  FILE *ifp;
  
  temp[4999] = (double)fopen("../data/taylor.txt","r");
  if ((FILE *)temp[4999] != (FILE *)0x0) {
    while (N_00 = Nseas, iVar1 = feof((FILE *)temp[4999]), iVar1 == 0) {
      __isoc99_fscanf(temp[4999],"%lf \n",temp + (long)Nseas + -1);
      Nseas = Nseas + 1;
    }
    printf("N %d \n",(ulong)(uint)Nseas);
    x_00 = (double *)malloc((long)Nseas << 3);
    for (Nseas = 0; Nseas < N_00; Nseas = Nseas + 1) {
      x_00[Nseas] = temp[(long)Nseas + -1];
    }
    f[0] = 2;
    _uStack_9c78 = 0x15000000030;
    seasonal._4_4_ = 2;
    lambda._4_4_ = 0xd;
    trend = (double *)calloc(2,8);
    remainder = (double *)calloc((long)N_00,8);
    pdStack_9c98 = (double *)calloc((long)N_00,8);
    for (Nseas = 0; Nseas < f[0]; Nseas = Nseas + 1) {
      pvVar2 = calloc((long)N_00,8);
      trend[Nseas] = (double)pvVar2;
    }
    mstl(x_00,N_00,(int *)&uStack_9c78,f,(int *)((long)&lambda + 4),(double *)0x0,
         (int *)((long)&seasonal + 4),(double **)trend,remainder,pdStack_9c98);
    for (Nseas = 0; Nseas < f[0]; Nseas = Nseas + 1) {
      printf("\n Seasonal%d :\n",(ulong)(&uStack_9c78)[Nseas]);
      for (f[1] = 0; f[1] < N_00; f[1] = f[1] + 1) {
        printf("%g ",*(undefined8 *)((long)trend[Nseas] + (long)f[1] * 8));
      }
      printf("\n\n");
    }
    mdisplay(remainder,1,N_00);
    mdisplay(pdStack_9c98,1,N_00);
    printf("\n %g %g %g %g \n",*x_00,x_00[1],x_00[N_00 + -2],x_00[N_00 + -1]);
    free(trend);
    free(remainder);
    free(pdStack_9c98);
    free(x_00);
    fclose((FILE *)temp[4999]);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void mstltest() {
	FILE *ifp;
	double temp[5000];
	double *x;
    ifp = fopen("../data/taylor.txt", "r");
	int N;
	int i,j;

	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}

	N = i;

	printf("N %d \n",N);

	x = (double*) malloc(sizeof(double)*N);

	for(i = 0; i < N;++i) {
		x[i] = temp[i];
	}
	int Nseas = 2;
	int f[2] = {48,336};
	int iterate = 2;
	double **seasonal,*trend,*remainder;
	int s_window = 13;
	double lambda;

	seasonal = (double**)calloc(Nseas,sizeof(double*));
	trend = (double*)calloc(N,sizeof(double));
	remainder = (double*)calloc(N,sizeof(double));

	for(i = 0; i < Nseas;++i) {
		seasonal[i] = (double*)calloc(N,sizeof(double));
	}

	mstl(x, N,f,&Nseas,&s_window,NULL,&iterate,seasonal,trend,remainder);

	for(i = 0; i < Nseas;++i) {
		printf("\n Seasonal%d :\n",f[i]);
		for(j = 0; j < N;++j) {
			printf("%g ",seasonal[i][j]);
		}
		printf("\n\n");
	}

	mdisplay(trend,1,N);
	mdisplay(remainder,1,N);

	printf("\n %g %g %g %g \n",x[0],x[1],x[N-2],x[N-1]);
	free(seasonal);
	free(trend);
	free(remainder);
	free(x);
	fclose(ifp);
}